

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O3

void asmjit::_abi_1_10::x86::rwZeroExtendAvxVec(OpRWInfo *opRwInfo,Vec *reg)

{
  ulong uVar1;
  
  uVar1 = opRwInfo->_writeByteMask >> 1 | opRwInfo->_writeByteMask;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  uVar1 = uVar1 >> 0x20 | uVar1;
  if (uVar1 != 0xffffffffffffffff) {
    *(undefined1 *)&opRwInfo->_opFlags = (char)opRwInfo->_opFlags | kZExt;
    opRwInfo->_extendByteMask = ~uVar1;
  }
  return;
}

Assistant:

inline uint64_t writeByteMask() const noexcept { return _writeByteMask; }